

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_moveOperandToRegister
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t reg,int16_t operand)

{
  ulong uVar1;
  int32_t offset;
  sysbvm_x86_register_t sVar2;
  undefined6 in_register_00000012;
  int32_t offset_00;
  uint8_t local_1b [2];
  byte local_19;
  
  uVar1 = CONCAT62(in_register_00000012,operand) >> 2;
  if ((short)uVar1 < 0) {
    local_1b[0] = 'H';
    local_1b[1] = '3';
    local_19 = (byte)reg << 3 | (byte)reg & 7 | 0xc0;
    sysbvm_bytecodeJit_addBytes(jit,3,local_1b);
    return;
  }
  offset_00 = ((uint)uVar1 & 0xffff) * 8;
  sVar2 = reg;
  switch((uint)CONCAT62(in_register_00000012,operand) & 3) {
  case 0:
    sysbvm_jit_x86_mov64FromMemoryWithOffset(jit,reg,SYSBVM_X86_EBP,jit->argumentVectorOffset);
    goto LAB_0014a5c9;
  case 1:
    offset = jit->captureVectorOffset;
    break;
  case 2:
    offset = jit->literalVectorOffset;
    break;
  case 3:
    offset_00 = offset_00 + jit->localVectorOffset;
    sVar2 = SYSBVM_X86_EBP;
    goto LAB_0014a5c9;
  }
  sysbvm_jit_x86_mov64FromMemoryWithOffset(jit,reg,SYSBVM_X86_EBP,offset);
  offset_00 = offset_00 + 0x10;
LAB_0014a5c9:
  sysbvm_jit_x86_mov64FromMemoryWithOffset(jit,reg,sVar2,offset_00);
  return;
}

Assistant:

static void sysbvm_jit_moveOperandToRegister(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t reg, int16_t operand)
{
    sysbvm_operandVectorName_t vectorType = (sysbvm_operandVectorName_t) (operand & SYSBVM_OPERAND_VECTOR_BITMASK);
    int16_t vectorIndex = operand >> SYSBVM_OPERAND_VECTOR_BITS;
    if(vectorIndex < 0)
    {
        sysbvm_jit_x86_xorRegister(jit, reg, reg);
        return;
    }

    int32_t vectorOffset = (int32_t)vectorIndex * sizeof(void*);
    switch(vectorType)
    {
    case SYSBVM_OPERAND_VECTOR_ARGUMENTS:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, SYSBVM_X86_RBP, jit->argumentVectorOffset);
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, reg, vectorOffset);
        break;
    case SYSBVM_OPERAND_VECTOR_CAPTURES:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, SYSBVM_X86_RBP, jit->captureVectorOffset);
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, reg, sizeof(sysbvm_tuple_header_t) + vectorOffset);
        break;
    case SYSBVM_OPERAND_VECTOR_LITERAL:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, SYSBVM_X86_RBP, jit->literalVectorOffset);
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, reg, sizeof(sysbvm_tuple_header_t) + vectorOffset);
        break;
    case SYSBVM_OPERAND_VECTOR_LOCAL:
        sysbvm_jit_x86_mov64FromMemoryWithOffset(jit, reg, SYSBVM_X86_RBP, jit->localVectorOffset + vectorOffset);
        break;
    }
}